

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_cure_all(command *cmd)

{
  int16_t iVar1;
  long lVar2;
  void *p;
  player_upkeep *ppVar3;
  player *ppVar4;
  wchar_t subtype;
  long lVar5;
  ulong uVar6;
  source sVar7;
  source origin;
  source origin_00;
  
  lVar5 = 0x18;
  ppVar4 = player;
  for (uVar6 = 0; uVar6 < (ppVar4->body).count; uVar6 = uVar6 + 1) {
    lVar2 = *(long *)((long)&((ppVar4->body).slots)->next + lVar5);
    if ((lVar2 != 0) && (p = *(void **)(lVar2 + 0xe8), p != (void *)0x0)) {
      mem_free(p);
      ppVar4 = player;
      *(undefined8 *)(*(long *)((long)&((player->body).slots)->next + lVar5) + 0xe8) = 0;
    }
    lVar5 = lVar5 + 0x20;
  }
  for (subtype = L'\0'; subtype != L'\x05'; subtype = subtype + L'\x01') {
    sVar7 = source_player();
    origin.which = sVar7.which;
    origin._4_4_ = 0;
    origin.what = sVar7.what;
    effect_simple(L'\x10',origin,"0",subtype,L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  sVar7 = source_none();
  origin_00.which = sVar7.which;
  origin_00._4_4_ = 0;
  origin_00.what = sVar7.what;
  effect_simple(L'\x14',origin_00,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  ppVar4 = player;
  iVar1 = player->msp;
  player->chp = player->mhp;
  ppVar4->chp_frac = 0;
  ppVar4->csp = iVar1;
  ppVar4->csp_frac = 0;
  player_clear_timed(ppVar4,L'\x02',true,false);
  player_clear_timed(player,L'\x04',true,false);
  player_clear_timed(player,L'\a',true,false);
  player_clear_timed(player,L'\x05',true,false);
  player_clear_timed(player,L'\x03',true,false);
  player_clear_timed(player,L'\x06',true,false);
  player_clear_timed(player,L'\t',true,false);
  player_clear_timed(player,L'\b',true,false);
  player_clear_timed(player,L'\x01',true,false);
  player_clear_timed(player,L'\x19',true,false);
  player_set_timed(player,L'\n',PY_FOOD_FULL + L'\xffffffff',false,false);
  ppVar3 = player->upkeep;
  uVar6._0_4_ = ppVar3->update;
  uVar6._4_4_ = ppVar3->redraw;
  ppVar3->update = (int)(uVar6 | 0x5bfff00000062);
  ppVar3->redraw = (int)((uVar6 | 0x5bfff00000062) >> 0x20);
  msg("You feel *much* better!");
  return;
}

Assistant:

void do_cmd_wiz_cure_all(struct command *cmd)
{
	int i;

	/* Remove curses */
	for (i = 0; i < player->body.count; i++) {
		if (player->body.slots[i].obj &&
				player->body.slots[i].obj->curses) {
			mem_free(player->body.slots[i].obj->curses);
			player->body.slots[i].obj->curses = NULL;
		}
	}

	/* Restore stats */
	for (i = 0; i < STAT_MAX; i++) {
		effect_simple(EF_RESTORE_STAT, source_player(), "0", i,
			0, 0, 0, 0, NULL);
	}

	/* Restore the level */
	effect_simple(EF_RESTORE_EXP, source_none(), "0", 0, 0, 0, 0, 0, NULL);

	/* Heal the player */
	player->chp = player->mhp;
	player->chp_frac = 0;

	/* Restore mana */
	player->csp = player->msp;
	player->csp_frac = 0;

	/* Cure stuff */
	(void) player_clear_timed(player, TMD_BLIND, true, false);
	(void) player_clear_timed(player, TMD_CONFUSED, true, false);
	(void) player_clear_timed(player, TMD_POISONED, true, false);
	(void) player_clear_timed(player, TMD_AFRAID, true, false);
	(void) player_clear_timed(player, TMD_PARALYZED, true, false);
	(void) player_clear_timed(player, TMD_IMAGE, true, false);
	(void) player_clear_timed(player, TMD_STUN, true, false);
	(void) player_clear_timed(player, TMD_CUT, true, false);
	(void) player_clear_timed(player, TMD_SLOW, true, false);
	(void) player_clear_timed(player, TMD_AMNESIA, true, false);

	/* No longer hungry */
	player_set_timed(player, TMD_FOOD, PY_FOOD_FULL - 1, false, false);

	/* Flag what needs to be updated or redrawn */
	player->upkeep->update |= PU_TORCH | PU_UPDATE_VIEW | PU_MONSTERS;
	player->upkeep->redraw |= PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP;

	/* Give the player some feedback */
	msg("You feel *much* better!");
}